

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void iterator_suite::test_const_iterator_constructible(void)

{
  ulong uVar1;
  bool bVar2;
  reference piVar3;
  ulong uVar4;
  const_iterator bravo;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  basic_iterator<const_int> local_78;
  iterator_type local_68;
  circular_view<int,_18446744073709551615UL> local_58;
  type local_38 [4];
  iterator_type local_28;
  
  local_58.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_58.member.cap = 4;
  local_58.member.size = 0;
  local_58.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_58,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_58);
  *piVar3 = 0xb;
  local_68.current = local_58.member.next - local_58.member.size;
  uVar1 = local_58.member.cap * 2;
  uVar4 = uVar1 - (local_58.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_78.current = uVar1 - 1 & local_68.current;
  }
  else {
    local_78.current = local_68.current % uVar1;
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_68.current = uVar1 - 1 & local_68.current;
  }
  else {
    local_68.current = local_68.current % uVar1;
  }
  local_78.parent = &local_58;
  local_68.parent = &local_58;
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    (&local_78,&local_68);
  boost::detail::test_impl
            ("alpha == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x29c,"void iterator_suite::test_const_iterator_constructible()",bVar2);
  local_68.parent = local_78.parent;
  local_68.current = local_78.current;
  local_28.current = local_58.member.cap * 2;
  if ((local_28.current & local_58.member.cap * 2 - 1) == 0) {
    local_28.current = local_28.current - 1 & local_58.member.next - local_58.member.size;
  }
  else {
    local_28.current = (local_58.member.next - local_58.member.size) % local_28.current;
  }
  local_28.parent = &local_58;
  bVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    (&local_68,&local_28);
  boost::detail::test_impl
            ("bravo == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x29e,"void iterator_suite::test_const_iterator_constructible()",bVar2);
  return;
}

Assistant:

void test_const_iterator_constructible()
{
    // Also checks implicit conversion from iterator to const_iterator
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    decltype(span)::const_iterator alpha; // DefaultConstructible
    alpha = span.begin();
    BOOST_TEST(alpha == span.begin());
    decltype(span)::const_iterator bravo(alpha); // CopyConstructible
    BOOST_TEST(bravo == span.begin());
}